

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

void __thiscall Assimp::Ogre::MeshXml::Reset(MeshXml *this)

{
  Skeleton *this_00;
  VertexDataXml *pVVar1;
  pointer paVar2;
  pointer pVVar3;
  pointer ppSVar4;
  SubMeshXml *this_01;
  SubMeshXml **mesh;
  pointer ppSVar5;
  
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
  }
  operator_delete(this_00);
  this->skeleton = (Skeleton *)0x0;
  pVVar1 = this->sharedVertexData;
  if (pVVar1 != (VertexDataXml *)0x0) {
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::~vector(&pVVar1->uvs);
    paVar2 = (pVVar1->tangents).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (paVar2 != (pointer)0x0) {
      operator_delete(paVar2);
    }
    paVar2 = (pVVar1->normals).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (paVar2 != (pointer)0x0) {
      operator_delete(paVar2);
    }
    paVar2 = (pVVar1->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (paVar2 != (pointer)0x0) {
      operator_delete(paVar2);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
    ::~_Rb_tree(&(pVVar1->super_IVertexData).boneAssignmentsMap._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree(&(pVVar1->super_IVertexData).vertexIndexMapping._M_t);
    pVVar3 = (pVVar1->super_IVertexData).boneAssignments.
             super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pVVar3 != (pointer)0x0) {
      operator_delete(pVVar3);
    }
  }
  operator_delete(pVVar1);
  this->sharedVertexData = (VertexDataXml *)0x0;
  ppSVar5 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar4 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar5 != ppSVar4) {
    do {
      this_01 = *ppSVar5;
      if (this_01 != (SubMeshXml *)0x0) {
        SubMeshXml::~SubMeshXml(this_01);
      }
      operator_delete(this_01);
      *ppSVar5 = (SubMeshXml *)0x0;
      ppSVar5 = ppSVar5 + 1;
    } while (ppSVar5 != ppSVar4);
    ppSVar5 = (this->subMeshes).
              super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->subMeshes).
        super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar5) {
      (this->subMeshes).
      super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppSVar5;
    }
  }
  return;
}

Assistant:

void MeshXml::Reset()
{
    OGRE_SAFE_DELETE(skeleton)
    OGRE_SAFE_DELETE(sharedVertexData)

    for(auto &mesh : subMeshes) {
        OGRE_SAFE_DELETE(mesh)
    }
    subMeshes.clear();
}